

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_priority_set(event *ev,int pri)

{
  int pri_local;
  event *ev_local;
  
  event_debug_assert_is_setup_(ev);
  if (((ev->ev_evcallback).evcb_flags & 8U) == 0) {
    if ((pri < 0) || (ev->ev_base->nactivequeues <= pri)) {
      ev_local._4_4_ = -1;
    }
    else {
      (ev->ev_evcallback).evcb_pri = (uint8_t)pri;
      ev_local._4_4_ = 0;
    }
  }
  else {
    ev_local._4_4_ = -1;
  }
  return ev_local._4_4_;
}

Assistant:

int
event_priority_set(struct event *ev, int pri)
{
	event_debug_assert_is_setup_(ev);

	if (ev->ev_flags & EVLIST_ACTIVE)
		return (-1);
	if (pri < 0 || pri >= ev->ev_base->nactivequeues)
		return (-1);

	ev->ev_pri = pri;

	return (0);
}